

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe35At4(uint8_t *buf)

{
  return (ulong)(*(ushort *)(buf + 3) & 0x7fff) << 0x14 | (ulong)buf[2] << 0xc | (ulong)buf[1] << 4
         | (ulong)(*buf >> 4);
}

Assistant:

std::uint64_t readFlUIntLe35At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 4;
    res |= (buf[0] >> 4);
    res &= UINT64_C(0x7ffffffff);
    return res;
}